

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextProcessDock(ImGuiContext_conflict *ctx,ImGuiDockRequest *req)

{
  ImGuiID IVar1;
  ImGuiWindow *window;
  ImGuiWindow *window_00;
  ImGuiTabBar *tab_bar_00;
  uint split_inheritor_child_idx_00;
  ImGuiTabItem *pIVar2;
  ImGuiWindow **ppIVar3;
  ImGuiDockNode *pIVar4;
  ImGuiDockNode *pIVar5;
  ImGuiDockNode *pIVar6;
  uint uVar7;
  bool bVar8;
  bool local_99;
  ImGuiID local_98;
  ImGuiTabBar *tab_bar;
  ImGuiID payload_dock_id_1;
  ImGuiID payload_dock_id;
  ImGuiDockNode *last_focused_root_node;
  ImGuiDockNode *last_focused_node;
  ImGuiDockNode *visible_node;
  int n;
  ImGuiDockNode *new_node;
  float split_ratio;
  int split_inheritor_child_idx;
  ImGuiAxis split_axis;
  ImGuiDir split_dir;
  ImGuiDockNode *payload_node;
  ImGuiDockNode *pIStack_38;
  ImGuiID next_selected_id;
  ImGuiDockNode *node;
  ImGuiWindow *target_window;
  ImGuiWindow *payload_window;
  ImGuiContext_conflict *g;
  ImGuiDockRequest *req_local;
  ImGuiContext_conflict *ctx_local;
  
  if (((req->Type != ImGuiDockRequestType_Dock) ||
      (bVar8 = true, req->DockPayload == (ImGuiWindow *)0x0)) &&
     (bVar8 = false, req->Type == ImGuiDockRequestType_Split)) {
    bVar8 = req->DockPayload == (ImGuiWindow *)0x0;
  }
  if (!bVar8) {
    __assert_fail("(req->Type == ImGuiDockRequestType_Dock && req->DockPayload != __null) || (req->Type == ImGuiDockRequestType_Split && req->DockPayload == __null)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3392,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
  }
  bVar8 = true;
  if (req->DockTargetWindow == (ImGuiWindow *)0x0) {
    bVar8 = req->DockTargetNode != (ImGuiDockNode *)0x0;
  }
  if (!bVar8) {
    __assert_fail("req->DockTargetWindow != __null || req->DockTargetNode != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3393,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
  }
  window = req->DockPayload;
  window_00 = req->DockTargetWindow;
  pIStack_38 = req->DockTargetNode;
  payload_node._4_4_ = 0;
  _split_axis = (ImGuiDockNode *)0x0;
  if (window != (ImGuiWindow *)0x0) {
    _split_axis = window->DockNodeAsHost;
    window->DockNodeAsHost = (ImGuiDockNode *)0x0;
    if ((_split_axis != (ImGuiDockNode *)0x0) &&
       (bVar8 = ImGuiDockNode::IsLeafNode(_split_axis), bVar8)) {
      if (_split_axis->TabBar->NextSelectedTabId == 0) {
        local_98 = _split_axis->TabBar->SelectedTabId;
      }
      else {
        local_98 = _split_axis->TabBar->NextSelectedTabId;
      }
      payload_node._4_4_ = local_98;
    }
    if (_split_axis == (ImGuiDockNode *)0x0) {
      payload_node._4_4_ = window->ID;
    }
  }
  if ((pIStack_38 != (ImGuiDockNode *)0x0) && (ctx->FrameCount < pIStack_38->LastFrameAlive)) {
    __assert_fail("node->LastFrameAlive <= g.FrameCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x33b0,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
  }
  if (((pIStack_38 != (ImGuiDockNode *)0x0) && (window_00 != (ImGuiWindow *)0x0)) &&
     (pIStack_38 == window_00->DockNodeAsHost)) {
    local_99 = true;
    if ((pIStack_38->Windows).Size < 1) {
      bVar8 = ImGuiDockNode::IsSplitNode(pIStack_38);
      local_99 = true;
      if (!bVar8) {
        local_99 = ImGuiDockNode::IsCentralNode(pIStack_38);
      }
    }
    if (local_99 == false) {
      __assert_fail("node->Windows.Size > 0 || node->IsSplitNode() || node->IsCentralNode()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x33b2,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                   );
    }
  }
  if (pIStack_38 == (ImGuiDockNode *)0x0) {
    pIStack_38 = DockContextAddNode(ctx,0);
    pIStack_38->Pos = window_00->Pos;
    pIStack_38->Size = window_00->Size;
    if (window_00->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      DockNodeAddWindow(pIStack_38,window_00,true);
      pIVar2 = ImVector<ImGuiTabItem>::operator[](&pIStack_38->TabBar->Tabs,0);
      pIVar2->Flags = pIVar2->Flags & 0xffbfffff;
      window_00->field_0x3e1 = window_00->field_0x3e1 & 0xfe | 1;
    }
  }
  uVar7 = req->DockSplitDir;
  if (uVar7 != 0xffffffff) {
    split_inheritor_child_idx_00 = (uint)(uVar7 == 0 || uVar7 == 2);
    DockNodeTreeSplit(ctx,pIStack_38,(uint)(1 < uVar7),split_inheritor_child_idx_00,
                      req->DockSplitRatio,_split_axis);
    pIVar4 = pIStack_38->ChildNodes[(int)(split_inheritor_child_idx_00 ^ 1)];
    pIVar4->HostWindow = pIStack_38->HostWindow;
    pIStack_38 = pIVar4;
  }
  ImGuiDockNode::SetLocalFlags(pIStack_38,pIStack_38->LocalFlags & 0xffffdfff);
  if (pIStack_38 == _split_axis) {
    pIStack_38->field_0xbe = pIStack_38->field_0xbe & 0xfd | 2;
  }
  else {
    if ((0 < (pIStack_38->Windows).Size) && (pIStack_38->TabBar == (ImGuiTabBar *)0x0)) {
      DockNodeAddTabBar(pIStack_38);
      for (visible_node._4_4_ = 0; visible_node._4_4_ < (pIStack_38->Windows).Size;
          visible_node._4_4_ = visible_node._4_4_ + 1) {
        tab_bar_00 = pIStack_38->TabBar;
        ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIStack_38->Windows,visible_node._4_4_);
        TabBarAddTab(tab_bar_00,0,*ppIVar3);
      }
    }
    if (_split_axis == (ImGuiDockNode *)0x0) {
      if (window != (ImGuiWindow *)0x0) {
        IVar1 = window->DockId;
        pIStack_38->VisibleWindow = window;
        DockNodeAddWindow(pIStack_38,window,true);
        if (IVar1 != 0) {
          DockSettingsRenameNodeReferences(IVar1,pIStack_38->ID);
        }
      }
    }
    else {
      bVar8 = ImGuiDockNode::IsSplitNode(_split_axis);
      if (bVar8) {
        if (0 < (pIStack_38->Windows).Size) {
          if (_split_axis->OnlyNodeWithWindows == (ImGuiDockNode *)0x0) {
            __assert_fail("payload_node->OnlyNodeWithWindows != __null",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                          ,0x33e4,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          pIVar4 = _split_axis->OnlyNodeWithWindows;
          if ((pIVar4->TabBar != (ImGuiTabBar *)0x0) && ((pIVar4->TabBar->Tabs).Size < 1)) {
            __assert_fail("visible_node->TabBar->Tabs.Size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                          ,0x33e7,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          DockNodeMoveWindows(pIStack_38,pIVar4);
          DockNodeMoveWindows(pIVar4,pIStack_38);
          DockSettingsRenameNodeReferences(pIStack_38->ID,pIVar4->ID);
        }
        bVar8 = ImGuiDockNode::IsCentralNode(pIStack_38);
        if (bVar8) {
          pIVar4 = DockContextFindNodeByID(ctx,_split_axis->LastFocusedNodeId);
          if (pIVar4 == (ImGuiDockNode *)0x0) {
            __assert_fail("last_focused_node != __null",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                          ,0x33f1,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          pIVar5 = DockNodeGetRootNode(pIVar4);
          pIVar6 = DockNodeGetRootNode(_split_axis);
          if (pIVar5 != pIVar6) {
            __assert_fail("last_focused_root_node == DockNodeGetRootNode(payload_node)",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                          ,0x33f3,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          uVar7 = pIVar4->LocalFlags | 0x800;
          pIVar4->LocalFlags = uVar7;
          ImGuiDockNode::SetLocalFlags(pIVar4,uVar7);
          ImGuiDockNode::SetLocalFlags(pIStack_38,pIStack_38->LocalFlags & 0xfffff7ff);
          pIVar5->CentralNode = pIVar4;
        }
        if ((pIStack_38->Windows).Size != 0) {
          __assert_fail("node->Windows.Size == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x33f9,
                        "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
        }
        DockNodeMoveChildNodes(pIStack_38,_split_axis);
      }
      else {
        IVar1 = _split_axis->ID;
        DockNodeMoveWindows(pIStack_38,_split_axis);
        DockSettingsRenameNodeReferences(IVar1,pIStack_38->ID);
      }
      DockContextRemoveNode(ctx,_split_axis,true);
    }
  }
  if (pIStack_38->TabBar != (ImGuiTabBar *)0x0) {
    pIStack_38->TabBar->NextSelectedTabId = payload_node._4_4_;
  }
  MarkIniSettingsDirty();
  return;
}

Assistant:

void ImGui::DockContextProcessDock(ImGuiContext* ctx, ImGuiDockRequest* req)
{
    IM_ASSERT((req->Type == ImGuiDockRequestType_Dock && req->DockPayload != NULL) || (req->Type == ImGuiDockRequestType_Split && req->DockPayload == NULL));
    IM_ASSERT(req->DockTargetWindow != NULL || req->DockTargetNode != NULL);

    ImGuiContext& g = *ctx;
    IM_UNUSED(g);

    ImGuiWindow* payload_window = req->DockPayload;     // Optional
    ImGuiWindow* target_window = req->DockTargetWindow;
    ImGuiDockNode* node = req->DockTargetNode;
    if (payload_window)
        IMGUI_DEBUG_LOG_DOCKING("DockContextProcessDock node 0x%08X target '%s' dock window '%s', split_dir %d\n", node ? node->ID : 0, target_window ? target_window->Name : "NULL", payload_window ? payload_window->Name : "NULL", req->DockSplitDir);
    else
        IMGUI_DEBUG_LOG_DOCKING("DockContextProcessDock node 0x%08X, split_dir %d\n", node ? node->ID : 0, req->DockSplitDir);

    // Decide which Tab will be selected at the end of the operation
    ImGuiID next_selected_id = 0;
    ImGuiDockNode* payload_node = NULL;
    if (payload_window)
    {
        payload_node = payload_window->DockNodeAsHost;
        payload_window->DockNodeAsHost = NULL; // Important to clear this as the node will have its life as a child which might be merged/deleted later.
        if (payload_node && payload_node->IsLeafNode())
            next_selected_id = payload_node->TabBar->NextSelectedTabId ? payload_node->TabBar->NextSelectedTabId : payload_node->TabBar->SelectedTabId;
        if (payload_node == NULL)
            next_selected_id = payload_window->ID;
    }

    // FIXME-DOCK: When we are trying to dock an existing single-window node into a loose window, transfer Node ID as well
    // When processing an interactive split, usually LastFrameAlive will be < g.FrameCount. But DockBuilder operations can make it ==.
    if (node)
        IM_ASSERT(node->LastFrameAlive <= g.FrameCount);
    if (node && target_window && node == target_window->DockNodeAsHost)
        IM_ASSERT(node->Windows.Size > 0 || node->IsSplitNode() || node->IsCentralNode());

    // Create new node and add existing window to it
    if (node == NULL)
    {
        node = DockContextAddNode(ctx, 0);
        node->Pos = target_window->Pos;
        node->Size = target_window->Size;
        if (target_window->DockNodeAsHost == NULL)
        {
            DockNodeAddWindow(node, target_window, true);
            node->TabBar->Tabs[0].Flags &= ~ImGuiTabItemFlags_Unsorted;
            target_window->DockIsActive = true;
        }
    }

    ImGuiDir split_dir = req->DockSplitDir;
    if (split_dir != ImGuiDir_None)
    {
        // Split into two, one side will be our payload node unless we are dropping a loose window
        const ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        const int split_inheritor_child_idx = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 1 : 0; // Current contents will be moved to the opposite side
        const float split_ratio = req->DockSplitRatio;
        DockNodeTreeSplit(ctx, node, split_axis, split_inheritor_child_idx, split_ratio, payload_node);  // payload_node may be NULL here!
        ImGuiDockNode* new_node = node->ChildNodes[split_inheritor_child_idx ^ 1];
        new_node->HostWindow = node->HostWindow;
        node = new_node;
    }
    node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_HiddenTabBar);

    if (node != payload_node)
    {
        // Create tab bar before we call DockNodeMoveWindows (which would attempt to move the old tab-bar, which would lead us to payload tabs wrongly appearing before target tabs!)
        if (node->Windows.Size > 0 && node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            for (int n = 0; n < node->Windows.Size; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }

        if (payload_node != NULL)
        {
            // Transfer full payload node (with 1+ child windows or child nodes)
            if (payload_node->IsSplitNode())
            {
                if (node->Windows.Size > 0)
                {
                    // We can dock a split payload into a node that already has windows _only_ if our payload is a node tree with a single visible node.
                    // In this situation, we move the windows of the target node into the currently visible node of the payload.
                    // This allows us to preserve some of the underlying dock tree settings nicely.
                    IM_ASSERT(payload_node->OnlyNodeWithWindows != NULL); // The docking should have been blocked by DockNodePreviewDockSetup() early on and never submitted.
                    ImGuiDockNode* visible_node = payload_node->OnlyNodeWithWindows;
                    if (visible_node->TabBar)
                        IM_ASSERT(visible_node->TabBar->Tabs.Size > 0);
                    DockNodeMoveWindows(node, visible_node);
                    DockNodeMoveWindows(visible_node, node);
                    DockSettingsRenameNodeReferences(node->ID, visible_node->ID);
                }
                if (node->IsCentralNode())
                {
                    // Central node property needs to be moved to a leaf node, pick the last focused one.
                    // FIXME-DOCK: If we had to transfer other flags here, what would the policy be?
                    ImGuiDockNode* last_focused_node = DockContextFindNodeByID(ctx, payload_node->LastFocusedNodeId);
                    IM_ASSERT(last_focused_node != NULL);
                    ImGuiDockNode* last_focused_root_node = DockNodeGetRootNode(last_focused_node);
                    IM_ASSERT(last_focused_root_node == DockNodeGetRootNode(payload_node));
                    last_focused_node->SetLocalFlags(last_focused_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode);
                    node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_CentralNode);
                    last_focused_root_node->CentralNode = last_focused_node;
                }

                IM_ASSERT(node->Windows.Size == 0);
                DockNodeMoveChildNodes(node, payload_node);
            }
            else
            {
                const ImGuiID payload_dock_id = payload_node->ID;
                DockNodeMoveWindows(node, payload_node);
                DockSettingsRenameNodeReferences(payload_dock_id, node->ID);
            }
            DockContextRemoveNode(ctx, payload_node, true);
        }
        else if (payload_window)
        {
            // Transfer single window
            const ImGuiID payload_dock_id = payload_window->DockId;
            node->VisibleWindow = payload_window;
            DockNodeAddWindow(node, payload_window, true);
            if (payload_dock_id != 0)
                DockSettingsRenameNodeReferences(payload_dock_id, node->ID);
        }
    }
    else
    {
        // When docking a floating single window node we want to reevaluate auto-hiding of the tab bar
        node->WantHiddenTabBarUpdate = true;
    }

    // Update selection immediately
    if (ImGuiTabBar* tab_bar = node->TabBar)
        tab_bar->NextSelectedTabId = next_selected_id;
    MarkIniSettingsDirty();
}